

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Factory.cpp
# Opt level: O1

bool Rml::Factory::InstanceElementText(Element *parent,String *in_text)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer ppVar2;
  pointer pcVar3;
  undefined **ppuVar4;
  code *pcVar5;
  size_type sVar6;
  undefined8 this;
  bool bVar7;
  uint uVar8;
  SystemInterface *pSVar9;
  char *pcVar10;
  StreamMemory *this_00;
  Context *this_01;
  String *pSVar11;
  long *plVar12;
  _Alloc_hider _Var13;
  size_type *psVar14;
  pointer ppVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  byte previous;
  byte c;
  long lVar17;
  bool bVar18;
  ulong uVar19;
  bool inside_brackets;
  bool inside_string;
  UniquePtr<Rml::StreamMemory> stream;
  String close_tag;
  String tag;
  String text;
  String open_tag;
  ElementPtr element;
  bool local_10a;
  bool local_109;
  _Head_base<0UL,_Rml::StreamMemory_*,_false> local_108;
  uint local_fc;
  undefined1 local_f8 [32];
  _Head_base<0UL,_Rml::Element_*,_false> local_d8;
  undefined1 local_d0 [40];
  String local_a8;
  String local_88;
  ulong local_68;
  undefined1 local_60 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  Element *local_38;
  
  if ((parent == (Element *)0x0) &&
     (bVar7 = Assert("RMLUI_ASSERT(parent)",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/Factory.cpp"
                     ,0x165), !bVar7)) {
    pcVar5 = (code *)invalidInstructionException();
    (*pcVar5)();
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  local_a8._M_string_length = 0;
  local_a8.field_2._M_local_buf[0] = '\0';
  pSVar9 = GetSystemInterface();
  if (pSVar9 != (SystemInterface *)0x0) {
    (*pSVar9->_vptr_SystemInterface[3])(pSVar9,&local_a8,in_text);
  }
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_a8._M_dataplus._M_p + local_a8._M_string_length);
  local_68 = local_a8._M_string_length;
  local_40 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_a8._M_dataplus._M_p;
  _Var13._M_p = local_a8._M_dataplus._M_p;
  if (0 < (long)local_a8._M_string_length >> 2) {
    _Var13._M_p = local_a8._M_dataplus._M_p + (local_a8._M_string_length & 0xfffffffffffffffc);
    lVar17 = ((long)local_a8._M_string_length >> 2) + 1;
    paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_a8._M_dataplus._M_p + 3);
    do {
      if ((0x20 < (ulong)(byte)paVar16->_M_local_buf[-3]) ||
         ((0x100002600U >> ((ulong)(byte)paVar16->_M_local_buf[-3] & 0x3f) & 1) == 0)) {
        paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(paVar16->_M_local_buf + -3);
        goto LAB_0023dba3;
      }
      if ((0x20 < (ulong)(byte)paVar16->_M_local_buf[-2]) ||
         ((0x100002600U >> ((ulong)(byte)paVar16->_M_local_buf[-2] & 0x3f) & 1) == 0)) {
        paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(paVar16->_M_local_buf + -2);
        goto LAB_0023dba3;
      }
      if ((0x20 < (ulong)(byte)paVar16->_M_local_buf[-1]) ||
         ((0x100002600U >> ((ulong)(byte)paVar16->_M_local_buf[-1] & 0x3f) & 1) == 0)) {
        paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(paVar16->_M_local_buf + -1);
        goto LAB_0023dba3;
      }
      if ((0x20 < (ulong)(byte)paVar16->_M_local_buf[0]) ||
         ((0x100002600U >> ((ulong)(byte)paVar16->_M_local_buf[0] & 0x3f) & 1) == 0))
      goto LAB_0023dba3;
      lVar17 = lVar17 + -1;
      paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(paVar16->_M_local_buf + 4);
    } while (1 < lVar17);
  }
  lVar17 = (long)paVar1 - (long)_Var13._M_p;
  paVar16 = paVar1;
  if (lVar17 == 1) {
LAB_0023db73:
    if ((0x20 < (ulong)(byte)*_Var13._M_p) ||
       ((0x100002600U >> ((ulong)(byte)*_Var13._M_p & 0x3f) & 1) == 0)) goto LAB_0023db8f;
  }
  else {
    if (lVar17 == 2) {
LAB_0023db57:
      if (((ulong)(byte)*_Var13._M_p < 0x21) &&
         ((0x100002600U >> ((ulong)(byte)*_Var13._M_p & 0x3f) & 1) != 0)) {
        _Var13._M_p = _Var13._M_p + 1;
        goto LAB_0023db73;
      }
    }
    else {
      if (lVar17 != 3) goto LAB_0023dba3;
      if (((ulong)(byte)*_Var13._M_p < 0x21) &&
         ((0x100002600U >> ((ulong)(byte)*_Var13._M_p & 0x3f) & 1) != 0)) {
        _Var13._M_p = _Var13._M_p + 1;
        goto LAB_0023db57;
      }
    }
LAB_0023db8f:
    paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var13._M_p;
  }
LAB_0023dba3:
  if (paVar16 == paVar1) {
LAB_0023e062:
    bVar7 = true;
  }
  else {
    local_10a = false;
    local_109 = false;
    bVar7 = local_a8._M_string_length == 0;
    if (bVar7) {
      bVar18 = false;
      uVar8 = 0;
    }
    else {
      bVar18 = false;
      uVar19 = 0;
      local_fc = 0;
      previous = 0;
      local_38 = parent;
      do {
        c = local_40->_M_local_buf[uVar19];
        pcVar10 = XMLParseTools::ParseDataBrackets(&local_10a,&local_109,c,previous);
        if (pcVar10 == (char *)0x0) {
          if (local_10a == false) {
            if (c == 0x3c) {
              bVar18 = true;
            }
          }
          else {
            local_fc = 1;
          }
        }
        else {
          Log::Message(LT_WARNING,"Failed to instance text element \'%s\'. %s",
                       local_a8._M_dataplus._M_p,pcVar10);
          c = previous;
        }
        parent = local_38;
        uVar8 = local_fc;
        if (pcVar10 != (char *)0x0) break;
        uVar19 = uVar19 + 1;
        bVar7 = local_68 == uVar19;
        previous = c;
      } while (!bVar7);
    }
    sVar6 = local_a8._M_string_length;
    if (bVar7) {
      if (bVar18) {
        this_00 = (StreamMemory *)operator_new(0x170);
        StreamMemory::StreamMemory(this_00,sVar6 + 0x20);
        local_108._M_head_impl = this_00;
        this_01 = Element::GetContext(parent);
        if (this_01 == (Context *)0x0) {
          local_d0._0_8_ = local_d0 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"body","");
        }
        else {
          pSVar11 = Context::GetDocumentsBaseTag_abi_cxx11_(this_01);
          local_d0._0_8_ = local_d0 + 0x10;
          pcVar3 = (pSVar11->_M_dataplus)._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)local_d0,pcVar3,pcVar3 + pSVar11->_M_string_length);
        }
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_f8,"<",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_d0);
        plVar12 = (long *)::std::__cxx11::string::append(local_f8);
        psVar14 = (size_type *)(plVar12 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar14) {
          local_88.field_2._M_allocated_capacity = *psVar14;
          local_88.field_2._8_8_ = plVar12[3];
          local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        }
        else {
          local_88.field_2._M_allocated_capacity = *psVar14;
          local_88._M_dataplus._M_p = (pointer)*plVar12;
        }
        local_88._M_string_length = plVar12[1];
        *plVar12 = (long)psVar14;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        ppVar2 = (pointer)(local_f8 + 0x10);
        if ((pointer)local_f8._0_8_ != ppVar2) {
          operator_delete((void *)local_f8._0_8_,(ulong)(local_f8._16_8_ + 1));
        }
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_60,"</",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_d0);
        plVar12 = (long *)::std::__cxx11::string::append(local_60);
        ppVar15 = (pointer)(plVar12 + 2);
        if ((pointer)*plVar12 == ppVar15) {
          local_f8._16_8_ = (ppVar15->first)._M_dataplus._M_p;
          local_f8._24_8_ = plVar12[3];
          local_f8._0_8_ = ppVar2;
        }
        else {
          local_f8._16_8_ = (ppVar15->first)._M_dataplus._M_p;
          local_f8._0_8_ = (pointer)*plVar12;
        }
        local_f8._8_8_ = plVar12[1];
        *plVar12 = (long)ppVar15;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        if ((ElementText *)local_60._0_8_ != (ElementText *)(local_60 + 0x10)) {
          operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
        }
        StreamMemory::Write(local_108._M_head_impl,local_88._M_dataplus._M_p,
                            local_88._M_string_length);
        Stream::Write(&(local_108._M_head_impl)->super_Stream,&local_a8);
        StreamMemory::Write(local_108._M_head_impl,(void *)local_f8._0_8_,local_f8._8_8_);
        StreamMemory::Seek(local_108._M_head_impl,0,0);
        InstanceElementStream(parent,&(local_108._M_head_impl)->super_Stream);
        if ((pointer)local_f8._0_8_ != ppVar2) {
          operator_delete((void *)local_f8._0_8_,(ulong)(local_f8._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
          operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
        }
        ::std::unique_ptr<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>_>::~unique_ptr
                  ((unique_ptr<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>_> *)
                   &local_108);
        goto LAB_0023e062;
      }
      local_f8._0_8_ = (pointer)0x0;
      local_f8._8_8_ = (pointer)0x0;
      local_f8._16_8_ = (pointer)0x0;
      if ((uVar8 & 1) != 0) {
        Variant::Variant((Variant *)local_d0);
        itlib::
        flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
        ::emplace<char_const(&)[10],Rml::Variant>
                  ((flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
                    *)local_f8,(char (*) [10])"data-text",(Variant *)local_d0);
        Variant::~Variant((Variant *)local_d0);
      }
      local_d0._0_8_ = local_d0 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"#text","");
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"#text","");
      InstanceElement((Factory *)local_60,parent,(String *)local_d0,&local_88,
                      (XMLAttributes *)local_f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
        operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
      }
      this = local_60._0_8_;
      if ((ElementText *)local_60._0_8_ == (ElementText *)0x0) {
        Log::Message(LT_ERROR,"Failed to instance text element \'%s\', instancer returned nullptr.",
                     local_a8._M_dataplus._M_p);
        if ((ElementText *)local_60._0_8_ != (ElementText *)0x0) {
          (**(code **)(*(long *)local_60._0_8_ + 0x10))();
        }
        ::std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
                   *)local_f8);
      }
      else {
        ppuVar4 = *(undefined ***)local_60._0_8_;
        if (ppuVar4 == &PTR__ElementText_00335bc8) {
          StringUtilities::DecodeRml((String *)local_d0,&local_a8);
          ::std::__cxx11::string::operator=((string *)&local_a8,(string *)local_d0);
          if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
            operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
          }
          ElementText::SetText((ElementText *)this,&local_a8);
          local_d8._M_head_impl = (Element *)local_60._0_8_;
          local_60._0_8_ = (ElementText *)0x0;
          Element::AppendChild(parent,(ElementPtr *)&local_d8,true);
          if ((ElementText *)local_d8._M_head_impl != (ElementText *)0x0) {
            (*(((Element *)&(local_d8._M_head_impl)->super_ScriptInterface)->super_ScriptInterface).
              super_Releasable._vptr_Releasable[2])();
          }
          local_d8._M_head_impl = (Element *)0x0;
        }
        else {
          pcVar10 = *(char **)(*(long *)(*(long *)local_60._0_8_ + -8) + 8);
          Log::Message(LT_ERROR,
                       "Failed to instance text element \'%s\'. Found type \'%s\', was expecting a derivative of ElementText."
                       ,local_a8._M_dataplus._M_p,pcVar10 + (*pcVar10 == '*'));
        }
        if ((ElementText *)local_60._0_8_ != (ElementText *)0x0) {
          (**(code **)(*(long *)local_60._0_8_ + 0x10))();
        }
        ::std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
                   *)local_f8);
        if (ppuVar4 == &PTR__ElementText_00335bc8) goto LAB_0023e062;
      }
    }
    bVar7 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,
                    CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                             local_a8.field_2._M_local_buf[0]) + 1);
  }
  return bVar7;
}

Assistant:

bool Factory::InstanceElementText(Element* parent, const String& in_text)
{
	RMLUI_ASSERT(parent);

	String text;
	if (SystemInterface* system_interface = GetSystemInterface())
		system_interface->TranslateString(text, in_text);

	// If this text node only contains white-space we don't want to construct it.
	const bool only_white_space = std::all_of(text.begin(), text.end(), &StringUtilities::IsWhitespace);
	if (only_white_space)
		return true;

	// See if we need to parse it as RML, and whether the text contains data expressions (curly brackets).
	bool parse_as_rml = false;
	bool has_data_expression = false;

	bool inside_brackets = false;
	bool inside_string = false;
	char previous = 0;
	for (const char c : text)
	{
		const char* error_str = XMLParseTools::ParseDataBrackets(inside_brackets, inside_string, c, previous);
		if (error_str)
		{
			Log::Message(Log::LT_WARNING, "Failed to instance text element '%s'. %s", text.c_str(), error_str);
			return false;
		}

		if (inside_brackets)
			has_data_expression = true;
		else if (c == '<')
			parse_as_rml = true;

		previous = c;
	}

	// If the text contains RML elements then run it through the XML parser again.
	if (parse_as_rml)
	{
		RMLUI_ZoneScopedNC("InstanceStream", 0xDC143C);
		auto stream = MakeUnique<StreamMemory>(text.size() + 32);
		Context* context = parent->GetContext();
		String tag = context ? context->GetDocumentsBaseTag() : "body";
		String open_tag = "<" + tag + ">";
		String close_tag = "</" + tag + ">";
		stream->Write(open_tag.c_str(), open_tag.size());
		stream->Write(text);
		stream->Write(close_tag.c_str(), close_tag.size());
		stream->Seek(0, SEEK_SET);

		InstanceElementStream(parent, stream.get());
	}
	else
	{
		RMLUI_ZoneScopedNC("InstanceText", 0x8FBC8F);

		// Attempt to instance the element.
		XMLAttributes attributes;

		// If we have curly brackets in the text, we tag the element so that the appropriate data view (DataViewText) is constructed.
		if (has_data_expression)
			attributes.emplace("data-text", Variant());

		ElementPtr element = Factory::InstanceElement(parent, "#text", "#text", attributes);
		if (!element)
		{
			Log::Message(Log::LT_ERROR, "Failed to instance text element '%s', instancer returned nullptr.", text.c_str());
			return false;
		}

		// Assign the element its text value.
		ElementText* text_element = rmlui_dynamic_cast<ElementText*>(element.get());
		if (!text_element)
		{
			Log::Message(Log::LT_ERROR, "Failed to instance text element '%s'. Found type '%s', was expecting a derivative of ElementText.",
				text.c_str(), rmlui_type_name(*element));
			return false;
		}

		// Unescape any escaped entities or unicode symbols
		text = StringUtilities::DecodeRml(text);

		text_element->SetText(text);

		// Add to active node.
		parent->AppendChild(std::move(element));
	}

	return true;
}